

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom(FileDescriptorProto *this,Message *from)

{
  FileDescriptorProto *pFVar1;
  Message *in_RDI;
  FileDescriptorProto *in_stack_00000008;
  FileDescriptorProto *in_stack_00000010;
  FileDescriptorProto *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pFVar1 = DynamicCastToGenerated<google::protobuf::FileDescriptorProto>(in_RDI);
  if (pFVar1 == (FileDescriptorProto *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(in_stack_00000010,in_stack_00000008);
  }
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.FileDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  const FileDescriptorProto* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<FileDescriptorProto>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.FileDescriptorProto)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.FileDescriptorProto)
    MergeFrom(*source);
  }
}